

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterpretedLiteralEvaluator.cpp
# Opt level: O2

bool __thiscall
Kernel::InterpretedLiteralEvaluator::IntEvaluator::tryEvaluateUnaryFunc
          (IntEvaluator *this,Interpretation op,Value *arg,Value *res)

{
  bool bVar1;
  __mpz_struct *this_00;
  __mpz_struct local_40;
  __mpz_struct local_30;
  
  bVar1 = false;
  switch(op) {
  case INT_SUCCESSOR:
    IntegerConstantType::IntegerConstantType((IntegerConstantType *)&local_30,1);
    IntegerConstantType::operator+((IntegerConstantType *)&local_40,arg);
    mpz_swap(res->_val,&local_40);
    IntegerConstantType::~IntegerConstantType((IntegerConstantType *)&local_40);
    this_00 = &local_30;
    goto LAB_004347cf;
  case INT_UNARY_MINUS:
    IntegerConstantType::operator-((IntegerConstantType *)&local_40);
    mpz_swap(res->_val,&local_40);
    break;
  default:
    goto switchD_00434710_caseD_19;
  case INT_FLOOR:
  case INT_CEILING:
  case INT_TRUNCATE:
  case INT_ROUND:
switchD_00434710_caseD_22:
    mpz_set(res->_val,arg->_val);
    goto LAB_004347d4;
  case INT_ABS:
    IntegerConstantType::IntegerConstantType((IntegerConstantType *)&local_40,0);
    bVar1 = Kernel::operator<(arg,(IntegerConstantType *)&local_40);
    IntegerConstantType::~IntegerConstantType((IntegerConstantType *)&local_40);
    if (!bVar1) goto switchD_00434710_caseD_22;
    IntegerConstantType::operator-((IntegerConstantType *)&local_40);
    mpz_swap(res->_val,&local_40);
  }
  this_00 = &local_40;
LAB_004347cf:
  IntegerConstantType::~IntegerConstantType((IntegerConstantType *)this_00);
LAB_004347d4:
  bVar1 = true;
switchD_00434710_caseD_19:
  return bVar1;
}

Assistant:

virtual bool tryEvaluateUnaryFunc(Interpretation op, const Value& arg, Value& res)
  {
    switch(op) {
    case Theory::INT_UNARY_MINUS:
      res = -arg;
      return true;
    case Theory::INT_ABS:
      if (arg < IntegerConstantType(0)) {
        res = -arg;
      } else {
        res = arg;
      }
      return true;
    case Theory::INT_SUCCESSOR:
      res = arg+ IntegerConstantType(1);
      return true;
    case Theory::INT_FLOOR:
    case Theory::INT_CEILING:
    case Theory::INT_TRUNCATE:
    case Theory::INT_ROUND:
       // For integers these do nothing
      res = arg;
      return true;
    default:
      return false;
    }
  }